

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-utils.h
# Opt level: O3

uint64_t dg::llvmutils::getConstantValue(Value *op)

{
  uint uVar1;
  int iVar2;
  uint64_t uVar3;
  Value *pVVar4;
  
  uVar3 = Offset::UNKNOWN;
  if ((op != (Value *)0x0) && (op[0x10] == (Value)0x10)) {
    uVar1 = *(uint *)(op + 0x20);
    pVVar4 = op + 0x18;
    if ((0x40 < uVar1) && (iVar2 = llvm::APInt::countLeadingZerosSlowCase(), 0x40 < uVar1 - iVar2))
    {
      return 0xffffffffffffffff;
    }
    if (0x40 < uVar1) {
      pVVar4 = *(Value **)pVVar4;
    }
    uVar3 = *(uint64_t *)pVVar4;
  }
  return uVar3;
}

Assistant:

inline uint64_t getConstantValue(const llvm::Value *op) {
    using namespace llvm;

    // FIXME: we should get rid of this dependency
    static_assert(sizeof(Offset::type) == sizeof(uint64_t),
                  "The code relies on Offset::type having 8 bytes");

    uint64_t size = Offset::UNKNOWN;
    if (const ConstantInt *C = dyn_cast<ConstantInt>(op)) {
        size = C->getLimitedValue();
    }

    // size is ~((uint64_t)0) if it is unknown
    return size;
}